

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_test.cpp
# Opt level: O2

void __thiscall Half_Basics_Test::TestBody(Half_Basics_Test *this)

{
  char *pcVar1;
  uint32_t bits;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  Half h;
  undefined1 extraout_var [60];
  
  local_58.ptr_._0_2_ = 0;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)&gtest_ar,"Half(0.f).Bits()","HalfPositiveZero",(unsigned_short *)&local_58
             ,&pbrt::HalfPositiveZero);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
               ,0x7e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_58.ptr_._0_2_ = 0x8000;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)&gtest_ar,"Half(-0.f).Bits()","HalfNegativeZero",
             (unsigned_short *)&local_58,&pbrt::HalfNegativeZero);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
               ,0x7f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_58.ptr_._0_2_ = 0x7c00;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)&gtest_ar,"Half(Infinity).Bits()","HalfPositiveInfinity",
             (unsigned_short *)&local_58,&pbrt::HalfPositiveInfinity);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
               ,0x80,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_58.ptr_._0_2_ = 0xfc00;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)&gtest_ar,"Half(-Infinity).Bits()","HalfNegativeInfinity",
             (unsigned_short *)&local_58,&pbrt::HalfNegativeInfinity);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
               ,0x81,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  for (uVar2 = 0; uVar2 != 0x10000; uVar2 = uVar2 + 1) {
    local_58.ptr_._0_2_ = (ushort)uVar2;
    if ((((ushort)local_58.ptr_ & 0x7fff) != 0x7c00) &&
       ((~uVar2 & 0x7c00) != 0 || (uVar2 & 0x3ff) == 0)) {
      h.h = (ushort)local_58.ptr_;
      testing::internal::CmpHelperEQ<pbrt::Half,pbrt::Half>
                ((internal *)&gtest_ar,"h","-(-h)",&h,(Half *)&local_58);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_58);
        pcVar1 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
                   ,0x8b,pcVar1);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_58);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_58.ptr_._0_2_ = h.h ^ 0x8000;
      auVar4._0_4_ = pbrt::Half::operator_cast_to_float(&h);
      auVar4._4_60_ = extraout_var;
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar3 = vxorps_avx512vl(auVar4._0_16_,auVar3);
      pbrt::Half::Half((Half *)&local_50,auVar3._0_4_);
      testing::internal::CmpHelperEQ<pbrt::Half,pbrt::Half>
                ((internal *)&gtest_ar,"-h","Half(-float(h))",(Half *)&local_58,(Half *)&local_50);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_58);
        pcVar1 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/float_test.cpp"
                   ,0x8c,pcVar1);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_58);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
  }
  return;
}

Assistant:

TEST(Half, Basics) {
    EXPECT_EQ(Half(0.f).Bits(), HalfPositiveZero);
    EXPECT_EQ(Half(-0.f).Bits(), HalfNegativeZero);
    EXPECT_EQ(Half(Infinity).Bits(), HalfPositiveInfinity);
    EXPECT_EQ(Half(-Infinity).Bits(), HalfNegativeInfinity);

    EXPECT_TRUE(Half(std::numeric_limits<Float>::quiet_NaN()).IsNaN());
    EXPECT_TRUE(Half(std::numeric_limits<Float>::quiet_NaN()).IsNaN());
    EXPECT_FALSE(Half::FromBits(HalfPositiveInfinity).IsNaN());

    for (uint32_t bits = 0; bits < 65536; ++bits) {
        Half h = Half::FromBits(bits);
        if (h.IsInf() || h.IsNaN())
            continue;
        EXPECT_EQ(h, -(-h));
        EXPECT_EQ(-h, Half(-float(h)));
    }
}